

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::BitCountFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  LogicalType varargs_04;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  undefined4 in_stack_fffffffffffff644;
  undefined4 in_stack_fffffffffffff64c;
  FunctionNullHandling in_stack_fffffffffffff658;
  allocator_type local_9a1;
  bind_lambda_function_t in_stack_fffffffffffff660;
  scalar_function_t local_988;
  scalar_function_t local_968;
  scalar_function_t local_948;
  scalar_function_t local_928;
  scalar_function_t local_908;
  scalar_function_t local_8e8;
  LogicalType local_8c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_8b0;
  LogicalType local_898;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_880;
  LogicalType local_868;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_850;
  LogicalType local_838;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_820;
  LogicalType local_808;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7f0;
  LogicalType local_7d8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7c0;
  LogicalType local_7a8;
  LogicalType local_790;
  LogicalType local_778;
  LogicalType local_760;
  LogicalType local_748;
  LogicalType local_730;
  ScalarFunction local_718;
  ScalarFunction local_5f0;
  ScalarFunction local_4c8;
  ScalarFunction local_3a0;
  ScalarFunction local_278;
  ScalarFunction local_150;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff660,TINYINT);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffff660;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7c0,__l,&local_9a1);
  LogicalType::LogicalType(&local_7d8,TINYINT);
  local_8e8.super__Function_base._M_functor._8_8_ = 0;
  local_8e8.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<signed_char,signed_char,duckdb::BitCntOperator>;
  local_8e8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_8e8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_730,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_730;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff644;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff64c;
  ScalarFunction::ScalarFunction
            (&local_150,(vector<duckdb::LogicalType,_true> *)&local_7c0,&local_7d8,&local_8e8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffff658,in_stack_fffffffffffff660);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_150);
  ScalarFunction::~ScalarFunction(&local_150);
  LogicalType::~LogicalType(&local_730);
  ::std::_Function_base::~_Function_base(&local_8e8.super__Function_base);
  LogicalType::~LogicalType(&local_7d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7c0);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff660);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff660,SMALLINT);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&stack0xfffffffffffff660;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7f0,__l_00,&local_9a1);
  LogicalType::LogicalType(&local_808,TINYINT);
  local_908.super__Function_base._M_functor._8_8_ = 0;
  local_908.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<short,signed_char,duckdb::BitCntOperator>;
  local_908._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_908.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_748,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_748;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff644;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff64c;
  ScalarFunction::ScalarFunction
            (&local_278,(vector<duckdb::LogicalType,_true> *)&local_7f0,&local_808,&local_908,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffff658,in_stack_fffffffffffff660);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_278);
  ScalarFunction::~ScalarFunction(&local_278);
  LogicalType::~LogicalType(&local_748);
  ::std::_Function_base::~_Function_base(&local_908.super__Function_base);
  LogicalType::~LogicalType(&local_808);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7f0);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff660);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff660,INTEGER);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&stack0xfffffffffffff660;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_820,__l_01,&local_9a1);
  LogicalType::LogicalType(&local_838,TINYINT);
  local_928.super__Function_base._M_functor._8_8_ = 0;
  local_928.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<int,signed_char,duckdb::BitCntOperator>;
  local_928._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_928.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_760,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_760;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff644;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff64c;
  ScalarFunction::ScalarFunction
            (&local_3a0,(vector<duckdb::LogicalType,_true> *)&local_820,&local_838,&local_928,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_01,CONSISTENT,
             in_stack_fffffffffffff658,in_stack_fffffffffffff660);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a0);
  ScalarFunction::~ScalarFunction(&local_3a0);
  LogicalType::~LogicalType(&local_760);
  ::std::_Function_base::~_Function_base(&local_928.super__Function_base);
  LogicalType::~LogicalType(&local_838);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_820);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff660);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff660,BIGINT);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&stack0xfffffffffffff660;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_850,__l_02,&local_9a1);
  LogicalType::LogicalType(&local_868,TINYINT);
  local_948.super__Function_base._M_functor._8_8_ = 0;
  local_948.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<long,signed_char,duckdb::BitCntOperator>;
  local_948._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_948.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_778,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_778;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff644;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff64c;
  ScalarFunction::ScalarFunction
            (&local_4c8,(vector<duckdb::LogicalType,_true> *)&local_850,&local_868,&local_948,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_02,CONSISTENT,
             in_stack_fffffffffffff658,in_stack_fffffffffffff660);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4c8);
  ScalarFunction::~ScalarFunction(&local_4c8);
  LogicalType::~LogicalType(&local_778);
  ::std::_Function_base::~_Function_base(&local_948.super__Function_base);
  LogicalType::~LogicalType(&local_868);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_850);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff660);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff660,HUGEINT);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&stack0xfffffffffffff660;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_880,__l_03,&local_9a1);
  LogicalType::LogicalType(&local_898,TINYINT);
  local_968.super__Function_base._M_functor._8_8_ = 0;
  local_968.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::hugeint_t,signed_char,duckdb::HugeIntBitCntOperator>;
  local_968._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_968.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_790,INVALID);
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_03._0_8_ = &local_790;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff644;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff64c;
  ScalarFunction::ScalarFunction
            (&local_5f0,(vector<duckdb::LogicalType,_true> *)&local_880,&local_898,&local_968,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_03,CONSISTENT,
             in_stack_fffffffffffff658,in_stack_fffffffffffff660);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f0);
  ScalarFunction::~ScalarFunction(&local_5f0);
  LogicalType::~LogicalType(&local_790);
  ::std::_Function_base::~_Function_base(&local_968.super__Function_base);
  LogicalType::~LogicalType(&local_898);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_880);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff660);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff660,BIT);
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&stack0xfffffffffffff660;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_8b0,__l_04,&local_9a1);
  LogicalType::LogicalType(&local_8c8,BIGINT);
  local_988.super__Function_base._M_functor._8_8_ = 0;
  local_988.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::string_t,unsigned_long,duckdb::BitStringBitCntOperator>
  ;
  local_988._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_988.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_7a8,INVALID);
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_04._0_8_ = &local_7a8;
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff644;
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_04.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff64c;
  ScalarFunction::ScalarFunction
            (&local_718,(vector<duckdb::LogicalType,_true> *)&local_8b0,&local_8c8,&local_988,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_04,CONSISTENT,
             in_stack_fffffffffffff658,in_stack_fffffffffffff660);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_718);
  ScalarFunction::~ScalarFunction(&local_718);
  LogicalType::~LogicalType(&local_7a8);
  ::std::_Function_base::~_Function_base(&local_988.super__Function_base);
  LogicalType::~LogicalType(&local_8c8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_8b0);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff660);
  return in_RDI;
}

Assistant:

ScalarFunctionSet BitCountFun::GetFunctions() {
	ScalarFunctionSet functions;
	functions.AddFunction(ScalarFunction({LogicalType::TINYINT}, LogicalType::TINYINT,
	                                     ScalarFunction::UnaryFunction<int8_t, int8_t, BitCntOperator>));
	functions.AddFunction(ScalarFunction({LogicalType::SMALLINT}, LogicalType::TINYINT,
	                                     ScalarFunction::UnaryFunction<int16_t, int8_t, BitCntOperator>));
	functions.AddFunction(ScalarFunction({LogicalType::INTEGER}, LogicalType::TINYINT,
	                                     ScalarFunction::UnaryFunction<int32_t, int8_t, BitCntOperator>));
	functions.AddFunction(ScalarFunction({LogicalType::BIGINT}, LogicalType::TINYINT,
	                                     ScalarFunction::UnaryFunction<int64_t, int8_t, BitCntOperator>));
	functions.AddFunction(ScalarFunction({LogicalType::HUGEINT}, LogicalType::TINYINT,
	                                     ScalarFunction::UnaryFunction<hugeint_t, int8_t, HugeIntBitCntOperator>));
	functions.AddFunction(ScalarFunction({LogicalType::BIT}, LogicalType::BIGINT,
	                                     ScalarFunction::UnaryFunction<string_t, idx_t, BitStringBitCntOperator>));
	return functions;
}